

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_ext.cpp
# Opt level: O2

UChar32 ucnv_extSimpleMatchToU_63(int32_t *cx,char *source,int32_t length,UBool useFallback)

{
  UBool flush;
  ulong uVar1;
  uint in_EAX;
  int32_t iVar2;
  int iVar3;
  ulong uStack_18;
  uint32_t value;
  
  uStack_18 = (ulong)in_EAX;
  uVar1 = uStack_18;
  if (length < 1) {
    iVar3 = 0xffff;
  }
  else {
    flush = (UBool)in_EAX;
    uStack_18 = uVar1;
    iVar2 = ucnv_extMatchToU(cx,-1,source,length,(char *)0x0,0,&value,'\x01',flush);
    iVar3 = value - 0x1f0000;
    if (0x2fffff < value) {
      iVar3 = 0xfffe;
    }
    if (iVar2 != length) {
      iVar3 = 0xfffe;
    }
  }
  return iVar3;
}

Assistant:

U_CFUNC UChar32
ucnv_extSimpleMatchToU(const int32_t *cx,
                       const char *source, int32_t length,
                       UBool useFallback) {
    uint32_t value = 0;  /* initialize output-only param to 0 to silence gcc */
    int32_t match;

    if(length<=0) {
        return 0xffff;
    }

    /* try to match */
    match=ucnv_extMatchToU(cx, -1,
                           source, length,
                           NULL, 0,
                           &value,
                           useFallback, TRUE);
    if(match==length) {
        /* write result for simple, single-character conversion */
        if(UCNV_EXT_TO_U_IS_CODE_POINT(value)) {
            return UCNV_EXT_TO_U_GET_CODE_POINT(value);
        }
    }

    /*
     * return no match because
     * - match>0 && value points to string: simple conversion cannot handle multiple code points
     * - match>0 && match!=length: not all input consumed, forbidden for this function
     * - match==0: no match found in the first place
     * - match<0: partial match, not supported for simple conversion (and flush==TRUE)
     */
    return 0xfffe;
}